

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O1

expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunkExponents
          (expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  undefined8 uVar1;
  u64 *puVar2;
  decode_data *pdVar3;
  bool bVar4;
  __off_t _Var5;
  __off_t _Var6;
  ulong uVar7;
  FILE *pFVar8;
  long lVar9;
  name_map *pnVar10;
  idx2_err_code iVar11;
  byte bVar12;
  unsigned_long *Key;
  long lVar13;
  char *pcVar14;
  int iVar15;
  chunk_exp_cache *pcVar16;
  undefined8 __off;
  ulong uVar17;
  undefined7 in_register_00000081;
  chunk_exp_cache *Val;
  undefined7 in_register_00000089;
  ulong uVar18;
  undefined4 uVar19;
  uint uVar20;
  int iVar21;
  size_t sVar22;
  uint uVar23;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar24;
  int S;
  int ChunkAddrsSz;
  int NChunks;
  int ExponentSize;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:409:5)>
  __ScopeGuard__409;
  file_id FileId;
  iterator FileCacheIt;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:291:3)>
  __ScopeGuard__291;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:285:3)>
  __ScopeGuard__285;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:282:3)>
  __ScopeGuard__282;
  u64 ChunkAddr;
  u64 ChunkAddress;
  timer IOTimer;
  timer IOTimer_1;
  file_cache FileCache;
  chunk_exp_cache ChunkExpCache;
  int local_294;
  decode_data *local_290;
  FILE *local_288;
  int local_280;
  uint local_27c;
  expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *local_278;
  idx2_file *local_270;
  undefined4 local_268;
  uint local_264;
  int local_260;
  int local_25c;
  buffer local_258;
  chunk_exp_cache *local_238;
  anon_union_8_2_2df48d06_for_stref_0 local_230 [2];
  undefined1 local_220 [16];
  bucket_status *local_210;
  long local_208;
  long local_200;
  buffer *local_1f8;
  char local_1f0;
  buffer *local_1e8;
  char local_1e0;
  buffer *local_1d8;
  char local_1d0;
  u64 local_1c8;
  undefined1 local_1c0 [16];
  bucket_status *pbStack_1b0;
  undefined8 *local_1a8;
  undefined1 local_198 [40];
  allocator *local_170;
  iterator local_168;
  undefined1 local_148 [96];
  hash_table<unsigned_long,_idx2::chunk_exp_cache> local_e8;
  array<int> local_b8;
  undefined8 local_88;
  timespec local_70;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined1 local_38;
  
  local_264 = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_268 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_270 = Idx2;
  ConstructFilePath((file_id *)local_230,Idx2,Brick,(i8)Key,Subband,0);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_220 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_220,Key);
  clock_gettime(1,(timespec *)(local_198 + 0x20));
  local_1c8 = Brick;
  if ((*(char *)(*(long *)(local_208 + 0x10) + local_200) == '\x02') &&
     (local_210[200] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x10b;
    pcVar14 = "";
    uVar19 = 0;
    goto LAB_00193fa1;
  }
  pFVar8 = fopen(local_230[0].Ptr,"rb");
  local_288 = pFVar8;
  if (pFVar8 == (FILE *)0x0) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x10e;
    pnVar10 = &idx2_err_code_s::NameMap;
    iVar11 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
      lVar9 = 0x28;
      do {
        if (lVar9 == 0x3b8) {
          iVar11 = __Invalid__;
          goto LAB_00193ccb;
        }
        pcVar14 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
        lVar9 = lVar9 + 0x18;
      } while (*pcVar14 != '%');
      iVar11 = FileNotFound;
    }
LAB_00193ccb:
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar11) {
      lVar9 = 0;
      do {
        lVar13 = lVar9;
        if (lVar13 == 0x390) goto LAB_001944a2;
        lVar9 = lVar13 + 0x18;
      } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar13] != iVar11);
      pnVar10 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar13);
    }
    lVar9 = *in_FS_OFFSET;
    iVar15 = snprintf((char *)(lVar9 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                      (ulong)(uint)pnVar10->Arr[0].Name.Size,pnVar10->Arr[0].Name.field_0.Ptr,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                      ,0x10e);
    pcVar14 = "File: %s";
    snprintf((char *)(lVar9 + -0xf80) + iVar15,0x400 - (long)iVar15,"File: %s",local_230[0].Ptr);
    uVar19 = 0x10025;
    pFVar8 = local_288;
  }
  else {
    local_278 = __return_storage_ptr__;
    fseeko(pFVar8,0,2);
    _Var5 = ftello(pFVar8);
    local_25c = 0;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_25c,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    local_27c = 0;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_27c,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_280,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_1d8 = &local_258;
    local_258.Data = (byte *)0x0;
    local_258.Bytes = 0;
    local_258.Alloc = (allocator *)&Mallocator()::Instance;
    local_1d0 = '\0';
    lVar9 = (long)local_280;
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    AllocBuf(&local_258,lVar9,(allocator *)&Mallocator()::Instance);
    sVar22 = (size_t)local_280;
    if (local_258.Bytes < (long)sVar22) {
LAB_001944c4:
      __assert_fail("Sz <= Size(*Buf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                    ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
    }
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 - sVar22,0);
    fread(local_258.Data,sVar22,1,pFVar8);
    fseeko(pFVar8,_Var6 - sVar22,0);
    LOCK();
    (D->BytesData_).super___atomic_base<unsigned_long>._M_i =
         (D->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar22;
    UNLOCK();
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_1e8 = (buffer *)local_198;
    local_198._0_8_ = (allocator *)0x0;
    local_198._8_8_ = (chunk_exp_cache *)0x0;
    local_198._16_8_ = &Mallocator()::Instance;
    local_1e0 = '\0';
    lVar9 = (long)(int)local_27c;
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    AllocBuf((buffer *)local_198,lVar9 << 3,(allocator *)&Mallocator()::Instance);
    DecompressBufZstd(&local_258,(buffer *)local_198);
    local_294 = 0;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_294,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_1f8 = (buffer *)(local_1c0 + 8);
    local_1c0._8_8_ = (chunk_exp_cache *)0x0;
    pbStack_1b0 = (bucket_status *)0x0;
    local_1a8 = &Mallocator()::Instance;
    local_1f0 = '\0';
    lVar9 = (long)local_294;
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    AllocBuf((buffer *)(local_1c0 + 8),lVar9,(allocator *)&Mallocator()::Instance);
    sVar22 = (size_t)local_294;
    if ((long)pbStack_1b0 < (long)sVar22) goto LAB_001944c4;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 - sVar22,0);
    fread((void *)local_1c0._8_8_,sVar22,1,pFVar8);
    fseeko(pFVar8,_Var6 - sVar22,0);
    LOCK();
    (D->BytesExps_).super___atomic_base<unsigned_long>._M_i =
         (D->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar22 + 4;
    UNLOCK();
    clock_gettime(1,(timespec *)local_148);
    LOCK();
    (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
         (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
         (long)((double)(long)(local_148._0_8_ - local_198._32_8_) * 1000000000.0 +
               (double)(local_148._8_8_ - (long)local_170));
    UNLOCK();
    local_290 = D;
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_238 = (chunk_exp_cache *)local_1c0._8_8_;
    uVar7 = *(ulong *)local_1c0._8_8_;
    file_cache::file_cache((file_cache *)local_148);
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    Init<unsigned_long,idx2::chunk_exp_cache>
              ((hash_table<unsigned_long,_idx2::chunk_exp_cache> *)(local_148 + 0x60),10,
               (allocator *)&Mallocator()::Instance);
    iVar15 = local_294;
    local_88 = _Var5 - local_25c;
    GrowCapacity<int>((array<int> *)(local_148 + 0x90),(long)local_294);
    uVar18 = 0;
    if (0 < iVar15) {
      uVar23 = 0;
      iVar15 = 0;
      pcVar16 = local_238;
      do {
        bVar12 = 0;
        lVar9 = 0;
        do {
          if (0x39 < (int)uVar23) {
            uVar7 = *(ulong *)((long)&pcVar16->ChunkPos + (ulong)(uVar23 >> 3));
            pcVar16 = (chunk_exp_cache *)((long)&pcVar16->ChunkPos + (ulong)(uVar23 >> 3));
            uVar23 = uVar23 & 7;
          }
          uVar17 = uVar7 >> ((byte)uVar23 & 0x3f);
          uVar20 = uVar23 + 7;
          if (0x38 < (int)uVar23) {
            uVar7 = *(ulong *)((long)&pcVar16->ChunkPos + (ulong)(uVar20 >> 3));
            pcVar16 = (chunk_exp_cache *)((long)&pcVar16->ChunkPos + (ulong)(uVar20 >> 3));
            uVar20 = uVar20 & 7;
          }
          Val = (chunk_exp_cache *)(uVar7 >> ((byte)uVar20 & 0x3f));
          lVar9 = lVar9 + ((uVar17 & bitstream::Masks.Arr[7]) << (bVar12 & 0x3f));
          uVar23 = uVar20 + 1;
          bVar12 = bVar12 + 7;
        } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
        local_260 = iVar15;
        if (local_b8.Capacity <= local_b8.Size) {
          GrowCapacity<int>((array<int> *)(local_148 + 0x90),0);
        }
        iVar15 = local_260 + (int)lVar9;
        uVar1 = local_b8.Size + Tombstone;
        *(int *)(local_b8.Buffer.Data + local_b8.Size * 4) = iVar15;
        local_1c0._0_8_ = ((allocator *)(local_198._0_8_ + uVar18 * 8))->_vptr_allocator;
        local_b8.Size = uVar1;
        if (Mallocator()::Instance == '\0') {
          ReadChunkExponents();
        }
        local_70.tv_nsec = 0;
        uStack_60 = 0;
        local_58 = &Mallocator()::Instance;
        local_50 = 0;
        uStack_48 = 0;
        local_40 = 0;
        local_38 = 0;
        local_70.tv_sec._0_4_ = (undefined4)uVar18;
        Insert<unsigned_long,idx2::chunk_exp_cache>
                  (&local_168,(idx2 *)(local_148 + 0x60),
                   (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_1c0,
                   (unsigned_long *)&local_70,Val);
        uVar18 = uVar18 + 1;
        iVar21 = uVar20 + 0xf;
        if (-1 < (int)(uVar20 + 8)) {
          iVar21 = uVar20 + 8;
        }
        pFVar8 = local_288;
      } while ((long)pcVar16 + ((long)(iVar21 >> 3) - (long)local_238) < (long)local_294);
    }
    __return_storage_ptr__ = local_278;
    uVar23 = local_27c;
    D = local_290;
    if (local_27c == (uint)uVar18) {
      if ((long)(int)local_27c % (local_270->Subbands).Size != 0) {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x143;
        pnVar10 = &idx2_err_code_s::NameMap;
        iVar11 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SizeMismatched) {
          lVar9 = 0x28;
          do {
            if (lVar9 == 0x3b8) {
              iVar11 = __Invalid__;
              goto LAB_00193e8f;
            }
            pcVar14 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
            lVar9 = lVar9 + 0x18;
          } while (*pcVar14 != '\x04');
          iVar11 = SizeMismatched;
        }
LAB_00193e8f:
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar11) {
          lVar9 = 0;
          do {
            lVar13 = lVar9;
            if (lVar13 == 0x390) goto LAB_001944a2;
            lVar9 = lVar13 + 0x18;
          } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar13] != iVar11);
          pnVar10 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar13);
        }
        lVar9 = *in_FS_OFFSET;
        iVar15 = snprintf((char *)(lVar9 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)(uint)pnVar10->Arr[0].Name.Size,pnVar10->Arr[0].Name.field_0.Ptr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                          ,0x143);
        pcVar14 = "number of chunks = %d is not divisible by number of subbands which is %d\n";
        snprintf((char *)(lVar9 + -0xf80) + iVar15,0x400 - (long)iVar15,
                 "number of chunks = %d is not divisible by number of subbands which is %d\n",
                 (ulong)uVar23,(ulong)(uint)(local_270->Subbands).Size);
        goto LAB_00193f39;
      }
      if (*(char *)(*(long *)(local_208 + 0x10) + local_200) == '\x02') {
        *(undefined8 *)(local_210 + 0xc0) = local_88;
        *(byte **)(local_210 + 0x90) = local_b8.Buffer.Data;
        *(i64 *)(local_210 + 0x98) = local_b8.Buffer.Bytes;
        *(allocator **)(local_210 + 0xa0) = local_b8.Buffer.Alloc;
        *(i64 *)(local_210 + 0xa8) = local_b8.Size;
        *(allocator **)(local_210 + 0xa0) = local_b8.Buffer.Alloc;
        *(i64 *)(local_210 + 0xa8) = local_b8.Size;
        *(i64 *)(local_210 + 0xb0) = local_b8.Capacity;
        *(allocator **)(local_210 + 0xb8) = local_b8.Alloc;
        *(unsigned_long **)(local_210 + 0x60) = local_e8.Keys;
        *(chunk_exp_cache **)(local_210 + 0x68) = local_e8.Vals;
        *(bucket_status **)(local_210 + 0x70) = local_e8.Stats;
        *(i64 *)(local_210 + 0x78) = local_e8.Size;
        *(bucket_status **)(local_210 + 0x70) = local_e8.Stats;
        *(i64 *)(local_210 + 0x78) = local_e8.Size;
        *(i64 *)(local_210 + 0x80) = local_e8.LogCapacity;
        *(allocator **)(local_210 + 0x88) = local_e8.Alloc;
      }
      else {
        Insert<unsigned_long,idx2::file_cache>
                  ((iterator *)(local_220 + 8),(unsigned_long *)local_220,(file_cache *)local_148);
      }
      local_210[200] = Tombstone;
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x155;
      pcVar14 = "";
      uVar19 = 0;
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x13e;
      pnVar10 = &idx2_err_code_s::NameMap;
      iVar11 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SizeMismatched) {
        lVar9 = 0x28;
        do {
          if (lVar9 == 0x3b8) {
            iVar11 = __Invalid__;
            goto LAB_00193d77;
          }
          pcVar14 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
          lVar9 = lVar9 + 0x18;
        } while (*pcVar14 != '\x04');
        iVar11 = SizeMismatched;
      }
LAB_00193d77:
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar11) {
        lVar9 = 0;
        do {
          lVar13 = lVar9;
          if (lVar13 == 0x390) goto LAB_001944a2;
          lVar9 = lVar13 + 0x18;
        } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar13] != iVar11);
        pnVar10 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar13);
      }
      lVar9 = *in_FS_OFFSET;
      iVar15 = snprintf((char *)(lVar9 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)pnVar10->Arr[0].Name.Size,pnVar10->Arr[0].Name.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                        ,0x13e);
      pcVar14 = "number of chunks is either %d or %d\n";
      snprintf((char *)(lVar9 + -0xf80) + iVar15,0x400 - (long)iVar15,
               "number of chunks is either %d or %d\n",(ulong)uVar23,uVar18 & 0xffffffff);
      __return_storage_ptr__ = local_278;
LAB_00193f39:
      uVar19 = 0x10004;
      pFVar8 = local_288;
      D = local_290;
    }
    if (local_1f0 == '\0') {
      DeallocBuf(local_1f8);
    }
    if (local_1e0 == '\0') {
      DeallocBuf(local_1e8);
    }
    if (local_1d0 == '\0') {
      DeallocBuf(local_1d8);
    }
  }
  if (pFVar8 != (FILE *)0x0) {
    fclose(pFVar8);
  }
LAB_00193fa1:
  if ((char)uVar19 == '\0') {
    if (*(char *)(*(long *)(local_208 + 0x10) + local_200) == '\x02') {
      if ('\x0f' < (char)local_264) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar7 = (ulong)(local_270->BricksPerChunk).Arr[(char)local_264];
      lVar9 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      bVar12 = -(uVar7 == 0) | (byte)lVar9;
      local_198._0_8_ =
           (long)((int)(char)local_268 << 0xc) + ((ulong)(local_264 & 0xff) << 0x3c) +
           (local_1c8 >> ((1L << (bVar12 & 0x3f) != uVar7) + bVar12 & 0x3f)) * 0x40000;
      Lookup<unsigned_long,idx2::chunk_exp_cache>
                ((iterator *)local_148,(idx2 *)(local_210 + 0x60),
                 (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_198,
                 (unsigned_long *)local_198._0_8_);
      uVar1 = local_148._8_8_;
      if ((*(bucket_status **)(local_148._16_8_ + 0x10))[local_148._24_8_] == Occupied) {
        if ((((bitstream *)(local_148._8_8_ + 8))->Stream).Bytes == 0) {
          local_290 = D;
          clock_gettime(1,(timespec *)&local_168);
          pFVar8 = fopen(local_230[0].Ptr,"rb");
          if (pFVar8 == (FILE *)0x0) {
            local_148._0_8_ = local_230;
            eVar24 = ReadChunkExponents::anon_class_8_1_1e916d15::operator()
                               ((anon_class_8_1_1e916d15 *)local_148);
            __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0ad0;
            (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)eVar24.Msg;
            *(short *)((long)&__return_storage_ptr__->field_1 + 8) = eVar24._8_2_;
            (__return_storage_ptr__->field_1).Err.StrGened = eVar24.StrGened;
            __return_storage_ptr__->Ok = false;
          }
          else {
            lVar9 = (long)*(i32 *)uVar1;
            __off = *(undefined8 *)(local_210 + 0xc0);
            iVar15 = *(int *)(*(undefined8 *)(local_210 + 0x90) + lVar9 * 4);
            if (0 < lVar9) {
              iVar21 = *(int *)((*(undefined8 *)(local_210 + 0x90) - 4) + lVar9 * 4);
              __off = __off + (long)iVar21;
              iVar15 = iVar15 - iVar21;
            }
            fseeko(pFVar8,__off,0);
            if (Mallocator()::Instance == '\0') {
              ReadChunkExponents();
            }
            local_148._0_8_ = (anon_union_8_2_2df48d06_for_stref_0 *)0x0;
            local_148._8_8_ = (chunk_exp_cache *)0x0;
            local_148._16_8_ = &Mallocator()::Instance;
            local_258.Bytes = local_258.Bytes & 0xffffffffffffff00;
            sVar22 = (size_t)iVar15;
            local_258.Data = (byte *)local_148;
            if (Mallocator()::Instance == '\0') {
              ReadChunkExponents();
            }
            AllocBuf((buffer *)local_148,sVar22,(allocator *)&Mallocator()::Instance);
            fread((void *)local_148._0_8_,sVar22,1,pFVar8);
            DecompressBufZstd((buffer *)local_148,(bitstream *)(uVar1 + 8));
            pdVar3 = local_290;
            LOCK();
            (local_290->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
                 (local_290->BytesDecoded_).super___atomic_base<unsigned_long>._M_i + sVar22;
            UNLOCK();
            LOCK();
            (local_290->BytesExps_).super___atomic_base<unsigned_long>._M_i =
                 (local_290->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar22;
            UNLOCK();
            clock_gettime(1,&local_70);
            LOCK();
            (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
                 (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
                 (long)((double)(CONCAT44(local_70.tv_sec._4_4_,(undefined4)local_70.tv_sec) -
                                (long)local_168.Key) * 1000000000.0 +
                       (double)(local_70.tv_nsec - (long)local_168.Val));
            UNLOCK();
            puVar2 = (u64 *)(((bitstream *)(uVar1 + 8))->Stream).Data;
            ((bitstream *)(uVar1 + 8))->BitPtr = (byte *)puVar2;
            ((bitstream *)(uVar1 + 8))->BitPos = 0;
            ((bitstream *)(uVar1 + 8))->BitBuf = 0;
            ((bitstream *)(uVar1 + 8))->BitBuf = *puVar2;
            ((bitstream *)(uVar1 + 8))->BitPos = 0;
            if ((char)local_258.Bytes == '\0') {
              DeallocBuf((buffer *)local_258.Data);
            }
          }
          if (pFVar8 == (FILE *)0x0) {
            return __return_storage_ptr__;
          }
          fclose(pFVar8);
        }
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0ad0;
        (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)uVar1;
        bVar4 = true;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x184;
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0ad0;
        (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)0x1bd71d;
        (__return_storage_ptr__->field_1).Err.StrGened = false;
        *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x23;
        bVar4 = false;
      }
      __return_storage_ptr__->Ok = bVar4;
      return __return_storage_ptr__;
    }
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x17c;
    pnVar10 = &idx2_err_code_s::NameMap;
    iVar11 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
      lVar9 = 0x28;
      do {
        if (lVar9 == 0x3b8) {
          iVar11 = __Invalid__;
          goto LAB_00194352;
        }
        pcVar14 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
        lVar9 = lVar9 + 0x18;
      } while (*pcVar14 != '%');
      iVar11 = FileNotFound;
    }
LAB_00194352:
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar11) {
      lVar9 = 0;
      do {
        lVar13 = lVar9;
        if (lVar13 == 0x390) {
LAB_001944a2:
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                        ,0x38,"stref idx2::ToString(idx2_err_code)");
        }
        lVar9 = lVar13 + 0x18;
      } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar13] != iVar11);
      pnVar10 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar13);
    }
    lVar9 = *in_FS_OFFSET;
    iVar15 = snprintf((char *)(lVar9 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                      (ulong)(uint)pnVar10->Arr[0].Name.Size,pnVar10->Arr[0].Name.field_0.Ptr,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                      ,0x17c);
    snprintf((char *)(lVar9 + -0xf80) + iVar15,0x400 - (long)iVar15,"File: %s\n",local_230[0].Ptr);
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0ad0;
    (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)"File: %s\n";
    (__return_storage_ptr__->field_1).Err.StrGened = true;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x25;
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0x97c) = 0x17a;
    *(char **)(*in_FS_OFFSET + -0xb78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0ad0;
    (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)pcVar14;
    (__return_storage_ptr__->field_1).Err.StrGened = SUB41((uint)uVar19 >> 0x10,0);
    *(ushort *)((long)&__return_storage_ptr__->field_1 + 8) = (ushort)uVar19 | 0x100;
  }
  __return_storage_ptr__->Ok = false;
  return __return_storage_ptr__;
}

Assistant:

expected<const chunk_exp_cache*, idx2_err_code>
ReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return ChunkExpCacheIt.Val;

    //read the block
    // TOOD: who manages the memory for buff? (when do I deallocate it?)
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    if (!Result)
      idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    DeallocBuf(&buff);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return ChunkExpCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return ChunkCacheIt.Val;
}